

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O0

void __thiscall
QMarkdownTextEdit::initSearchFrame(QMarkdownTextEdit *this,QWidget *searchFrame,bool darkMode)

{
  QWidget *pQVar1;
  QWidget *local_28;
  QLayout *layout;
  bool darkMode_local;
  QWidget *searchFrame_local;
  QMarkdownTextEdit *this_local;
  
  this->_searchFrame = searchFrame;
  pQVar1 = (QWidget *)QWidget::layout();
  QLayout::removeWidget(pQVar1);
  local_28 = (QWidget *)QWidget::layout();
  if (local_28 == (QWidget *)0x0) {
    local_28 = (QWidget *)operator_new(0x20);
    QVBoxLayout::QVBoxLayout((QVBoxLayout *)local_28,this->_searchFrame);
    (**(code **)(*(long *)local_28 + 0x68))(local_28,0);
    QLayout::setContentsMargins((int)local_28,0,0,0);
  }
  QPlainTextEditSearchWidget::setDarkMode
            ((QPlainTextEditSearchWidget *)this->_searchWidget,darkMode);
  QLayout::addWidget(local_28);
  QWidget::setLayout((QLayout *)this->_searchFrame);
  return;
}

Assistant:

void QMarkdownTextEdit::initSearchFrame(QWidget *searchFrame, bool darkMode) {
    _searchFrame = searchFrame;

    // remove the search widget from our layout
    layout()->removeWidget(_searchWidget);

    QLayout *layout = _searchFrame->layout();

    // create a grid layout for the frame and add the search widget to it
    if (layout == nullptr) {
        layout = new QVBoxLayout(_searchFrame);
        layout->setSpacing(0);
        layout->setContentsMargins(0, 0, 0, 0);
    }

    _searchWidget->setDarkMode(darkMode);
    layout->addWidget(_searchWidget);
    _searchFrame->setLayout(layout);
}